

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFOBSFireFightingGraph.cpp
# Opt level: O2

string * __thiscall
ProblemFOBSFireFightingGraph::SoftPrintBriefDescription_abi_cxx11_
          (string *__return_storage_ptr__,ProblemFOBSFireFightingGraph *this,size_t nrAgents,
          size_t nrHouses,size_t nrFLs)

{
  ostream *poVar1;
  stringstream ss;
  stringstream asStack_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  poVar1 = std::operator<<(local_198,"_FireFightingGraph_");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"_");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"_");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  return __return_storage_ptr__;
}

Assistant:

string ProblemFOBSFireFightingGraph::SoftPrintBriefDescription(
    size_t nrAgents, size_t nrHouses, size_t nrFLs) const
{
    stringstream ss;
    ss << "_FireFightingGraph_" << nrAgents << 
        "_" << nrHouses <<
        "_" << nrFLs;
    return ss.str();
}